

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&this->super_IfcObject + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcObject).field_0x0 + lVar3);
  plVar2 = (long *)(&(this->super_IfcObject).
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20 + lVar3)
  ;
  plVar2[-0x17] = 0x8e4178;
  plVar2[5] = 0x8e41f0;
  plVar2[-6] = 0x8e41a0;
  plVar2[-4] = 0x8e41c8;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x8e4290;
  puVar1[0x1c] = 0x8e42b8;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0xf8);
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}